

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx2_mula2(uint16_t *array,uint32_t len,uint32_t *flags)

{
  ulong uVar1;
  ushort uVar2;
  undefined1 auVar3 [32];
  size_t i;
  long lVar4;
  uint32_t uVar5;
  ulong uVar6;
  long lVar7;
  int j;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  uint16_t tmp [16];
  __m256i counters [16];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 auStack_240 [71];
  
  for (lVar4 = 0; lVar4 != 0x200; lVar4 = lVar4 + 0x20) {
    *(undefined8 *)((long)auStack_240 + lVar4) = 0;
    *(undefined8 *)((long)auStack_240 + lVar4 + 8) = 0;
    *(undefined8 *)((long)auStack_240 + lVar4 + 0x10) = 0;
    *(undefined8 *)((long)auStack_240 + lVar4 + 0x18) = 0;
  }
  auVar8._8_2_ = 1;
  auVar8._0_8_ = 0x1000100010001;
  auVar8._10_2_ = 1;
  auVar8._12_2_ = 1;
  auVar8._14_2_ = 1;
  auVar8._16_2_ = 1;
  auVar8._18_2_ = 1;
  auVar8._20_2_ = 1;
  auVar8._22_2_ = 1;
  auVar8._24_2_ = 1;
  auVar8._26_2_ = 1;
  auVar8._28_2_ = 1;
  auVar8._30_2_ = 1;
  uVar6 = 0;
  while (uVar1 = uVar6 + 0x10, uVar1 <= len) {
    auVar9 = *(undefined1 (*) [32])(array + uVar6);
    for (lVar4 = 0; uVar6 = uVar1, lVar4 != 0x200; lVar4 = lVar4 + 0x20) {
      auVar3 = vpand_avx2(auVar9,auVar8);
      auVar3 = vpaddw_avx2(auVar3,*(undefined1 (*) [32])((long)auStack_240 + lVar4));
      auVar9 = vpsrlw_avx2(auVar9,1);
      *(undefined1 (*) [32])((long)auStack_240 + lVar4) = auVar3;
    }
  }
  for (; uVar6 < len; uVar6 = uVar6 + 1) {
    uVar2 = array[uVar6];
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      flags[lVar4] = flags[lVar4] + (uint)((uVar2 >> ((uint)lVar4 & 0x1f) & 1) != 0);
    }
  }
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    local_260 = auStack_240[lVar4 * 4];
    uStack_258 = auStack_240[lVar4 * 4 + 1];
    uStack_250 = auStack_240[lVar4 * 4 + 2];
    uStack_248 = auStack_240[lVar4 * 4 + 3];
    uVar5 = flags[lVar4];
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      uVar5 = uVar5 + *(ushort *)((long)&local_260 + lVar7 * 2);
    }
    flags[lVar4] = uVar5;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_mula2(const uint16_t* array, uint32_t len, uint32_t* flags) {
    __m256i counters[16];

    for (size_t i = 0; i < 16; ++i) {
        counters[i] = _mm256_setzero_si256();
    }

    size_t i = 0;
    for (/**/; i + 16 <= len; i += 16) {
        __m256i input = _mm256_loadu_si256((__m256i*)(array + i));

        for (int j = 0; j < 16; ++j) {
            __m256i bit = _mm256_and_si256(input, _mm256_set1_epi16(1));
            counters[j] = _mm256_add_epi16(counters[j], bit);
            input = _mm256_srli_epi16(input, 1);
        }
    }

     // residual
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    uint16_t tmp[16];
    for (size_t i = 0; i < 16; ++i) {
        _mm256_storeu_si256((__m256i*)tmp, counters[i]);
        for (int j=0; j < 16; ++j)
            flags[i] += tmp[j];
    }
    return 0;
}